

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall
cmComputeTargetDepends::AddObjectDepends
          (cmComputeTargetDepends *this,size_t depender_index,cmSourceFile *o,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *this_00;
  cmake *this_01;
  TargetType TVar2;
  pair<std::_Rb_tree_iterator<cmLinkItem>,_bool> pVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_108;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_f0;
  undefined1 local_c0 [24];
  cmGlobalGenerator *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  _Base_ptr local_30;
  
  cmSourceFile::GetObjectLibrary_abi_cxx11_((string *)(local_c0 + 0x10),o);
  if (local_a8 == (cmGlobalGenerator *)0x0) goto LAB_0047f2bd;
  this_00 = (this->Targets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start[depender_index];
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,local_c0._16_8_,
             (char *)(local_c0._16_8_ + (long)&local_a8->_vptr_cmGlobalGenerator));
  local_108.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_108.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_108);
  paVar1 = &local_f0.Value.field_2;
  if (local_128 == &local_118) {
    local_f0.Value.field_2._8_8_ = local_118._8_8_;
    local_f0.Value._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f0.Value._M_dataplus._M_p = (pointer)local_128;
  }
  local_f0.Value.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
  local_f0.Value.field_2._M_local_buf[0] = local_118._M_local_buf[0];
  local_f0.Value._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_108.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_108.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_108.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_108.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_128 = &local_118;
  cmGeneratorTarget::ResolveLinkItem
            ((cmLinkItem *)&local_90,this_00,&local_f0,&cmLinkItem::DEFAULT_abi_cxx11_);
  if (local_f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.Value._M_dataplus._M_p,local_f0.Value.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_108.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  pVar3 = std::
          _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
          ::_M_insert_unique<cmLinkItem_const&>
                    ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                      *)emitted,(cmLinkItem *)&local_90);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if (TVar2 != EXECUTABLE) {
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if (TVar2 != STATIC_LIBRARY) {
        TVar2 = cmGeneratorTarget::GetType(this_00);
        if (TVar2 != SHARED_LIBRARY) {
          TVar2 = cmGeneratorTarget::GetType(this_00);
          if (TVar2 != MODULE_LIBRARY) {
            TVar2 = cmGeneratorTarget::GetType(this_00);
            if (TVar2 != OBJECT_LIBRARY) {
              this_01 = this->GlobalGenerator->CMakeInstance;
              local_f0.Value._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f0,
                         "Only executables and libraries may reference target objects.","");
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_c0);
              cmake::IssueMessage(this_01,FATAL_ERROR,&local_f0.Value,
                                  (cmListFileBacktrace *)local_c0);
              if ((cmMakefile *)local_c0._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0.Value._M_dataplus._M_p != paVar1) {
                operator_delete(local_f0.Value._M_dataplus._M_p,
                                local_f0.Value.field_2._M_allocated_capacity + 1);
              }
              goto LAB_0047f269;
            }
          }
        }
      }
    }
    cmTarget::AddUtility(this_00->Target,(string *)(local_c0 + 0x10),false,(cmMakefile *)0x0);
  }
LAB_0047f269:
  if (local_30 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_allocated_capacity != local_80) {
    operator_delete((void *)local_90._M_allocated_capacity,local_80[0]._M_allocated_capacity + 1);
  }
LAB_0047f2bd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._16_8_ != &local_a0) {
    operator_delete((void *)local_c0._16_8_,local_a0._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddObjectDepends(size_t depender_index,
                                              cmSourceFile const* o,
                                              std::set<cmLinkItem>& emitted)
{
  std::string const& objLib = o->GetObjectLibrary();
  if (objLib.empty()) {
    return;
  }
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  cmLinkItem const& objItem =
    depender->ResolveLinkItem(BT<std::string>(objLib));
  if (emitted.insert(objItem).second) {
    if (depender->GetType() != cmStateEnums::EXECUTABLE &&
        depender->GetType() != cmStateEnums::STATIC_LIBRARY &&
        depender->GetType() != cmStateEnums::SHARED_LIBRARY &&
        depender->GetType() != cmStateEnums::MODULE_LIBRARY &&
        depender->GetType() != cmStateEnums::OBJECT_LIBRARY) {
      this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR,
        "Only executables and libraries may reference target objects.",
        depender->GetBacktrace());
      return;
    }
    const_cast<cmGeneratorTarget*>(depender)->Target->AddUtility(objLib,
                                                                 false);
  }
}